

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.cpp
# Opt level: O3

void duckdb_brotli::BrotliOptimizeHuffmanCountsForRle
               (size_t length,uint32_t *counts,uint8_t *good_for_rle)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint32_t uVar10;
  ulong uVar11;
  long lVar12;
  uint32_t *puVar13;
  ulong uVar14;
  ulong uVar15;
  uint32_t *puVar16;
  bool bVar17;
  int iVar19;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  
  if (length != 0) {
    sVar6 = 0;
    uVar9 = 0;
    do {
      uVar9 = (uVar9 + 1) - (ulong)(counts[sVar6] == 0);
      sVar6 = sVar6 + 1;
    } while (length != sVar6);
    if (0xf < uVar9) {
      puVar16 = counts + -1;
      do {
        if (puVar16[length] != 0) {
          uVar5 = 0x40000000;
          uVar11 = 0;
          uVar9 = 0;
          do {
            uVar14 = uVar9;
            uVar1 = counts[uVar11];
            uVar8 = uVar1;
            if (uVar5 < uVar1) {
              uVar8 = uVar5;
            }
            if (uVar1 == 0) {
              uVar8 = uVar5;
            }
            uVar5 = uVar8;
            uVar9 = (uVar1 != 0) + uVar14;
            uVar11 = uVar11 + 1;
          } while (uVar11 < length);
          if (uVar9 < 5) {
            return;
          }
          if (((uVar5 < 4) && (((length - 1) + (ulong)(uVar1 == 0)) - uVar14 < 6)) &&
             (1 < length - 1)) {
            uVar11 = 1;
            do {
              if (((counts[uVar11 - 1] != 0) && (counts[uVar11] == 0)) && (counts[uVar11 + 1] != 0))
              {
                counts[uVar11] = 1;
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 < length - 1);
          }
          if (uVar9 < 0x1c) {
            return;
          }
          uVar11 = 0;
          switchD_010444a0::default(good_for_rle,0,length);
          uVar10 = *counts;
          uVar9 = 0;
          do {
            if ((length == uVar9) || (counts[uVar9] != uVar10)) {
              if ((uVar10 == 0 && 4 < uVar11) || (6 < uVar11 && uVar10 != 0)) {
                switchD_010444a0::default(good_for_rle + (uVar9 - uVar11),1,uVar11);
              }
              uVar11 = 1;
              if (length != uVar9) {
                uVar10 = counts[uVar9];
              }
            }
            else {
              uVar11 = uVar11 + 1;
            }
            auVar4 = _DAT_01db9e50;
            auVar3 = _DAT_01d8a390;
            auVar2 = _DAT_01d8a380;
            bVar17 = uVar9 < length;
            uVar9 = uVar9 + 1;
          } while (bVar17);
          uVar9 = (ulong)(((counts[1] + *counts + counts[2]) * 0x100) / 3 + 0x1a4);
          uVar15 = 0;
          uVar14 = 0;
          uVar11 = 0;
          do {
            if (((length == uVar11) || (good_for_rle[uVar11] != '\0')) ||
               (((uVar11 != 0 && (good_for_rle[uVar11 - 1] != '\0')) ||
                (((counts[uVar11] << 8) - uVar9) - 0x4d8 < 0xfffffffffffff650)))) {
              if ((3 < uVar14) || ((uVar14 == 3 && (uVar15 == 0)))) {
                uVar9 = (uVar14 >> 1) + uVar15;
                uVar10 = (uint32_t)(uVar9 / uVar14);
                if (uVar9 < uVar14) {
                  uVar10 = 1;
                }
                if (uVar15 == 0) {
                  uVar10 = 0;
                }
                lVar12 = uVar14 - 1;
                auVar18._8_4_ = (int)lVar12;
                auVar18._0_8_ = lVar12;
                auVar18._12_4_ = (int)((ulong)lVar12 >> 0x20);
                auVar18 = auVar18 ^ auVar3;
                uVar9 = 0;
                puVar13 = puVar16;
                auVar20 = auVar2;
                auVar21 = auVar4;
                do {
                  auVar22 = auVar20 ^ auVar3;
                  iVar19 = auVar18._4_4_;
                  if ((bool)(~(auVar22._4_4_ == iVar19 && auVar18._0_4_ < auVar22._0_4_ ||
                              iVar19 < auVar22._4_4_) & 1)) {
                    *puVar13 = uVar10;
                  }
                  if ((auVar22._12_4_ != auVar18._12_4_ || auVar22._8_4_ <= auVar18._8_4_) &&
                      auVar22._12_4_ <= auVar18._12_4_) {
                    counts[uVar11 + (uVar9 ^ 0x3ffffffffffffffe)] = uVar10;
                  }
                  iVar23 = SUB164(auVar21 ^ auVar3,4);
                  if (iVar23 <= iVar19 &&
                      (iVar23 != iVar19 || SUB164(auVar21 ^ auVar3,0) <= auVar18._0_4_)) {
                    counts[uVar11 + (uVar9 ^ 0x3ffffffffffffffd)] = uVar10;
                    counts[uVar11 + (uVar9 ^ 0x3ffffffffffffffc)] = uVar10;
                  }
                  uVar9 = uVar9 + 4;
                  lVar12 = auVar20._8_8_;
                  auVar20._0_8_ = auVar20._0_8_ + 4;
                  auVar20._8_8_ = lVar12 + 4;
                  lVar12 = auVar21._8_8_;
                  auVar21._0_8_ = auVar21._0_8_ + 4;
                  auVar21._8_8_ = lVar12 + 4;
                  puVar13 = puVar13 + -4;
                } while ((uVar14 + 3 & 0xfffffffffffffffc) != uVar9);
              }
              if (uVar11 < length - 2) {
                uVar5 = ((counts[uVar11 + 1] + counts[uVar11] + counts[uVar11 + 2]) * 0x100) / 3 +
                        0x1a4;
              }
              else {
                uVar5 = 0;
                if (uVar11 < length) {
                  uVar5 = counts[uVar11] << 8;
                }
              }
              uVar14 = 1;
              uVar9 = (ulong)uVar5;
              if (length == uVar11) {
                uVar15 = 0;
              }
              else {
                uVar15 = (ulong)counts[uVar11];
              }
            }
            else {
              uVar14 = uVar14 + 1;
              uVar15 = uVar15 + counts[uVar11];
              if (3 < uVar14) {
                uVar7 = ((uVar14 >> 1) + uVar15 * 0x100) / uVar14;
                uVar9 = uVar7 + 0x78;
                if (uVar14 != 4) {
                  uVar9 = uVar7;
                }
              }
            }
            puVar16 = puVar16 + 1;
            bVar17 = uVar11 < length;
            uVar11 = uVar11 + 1;
          } while (bVar17);
          return;
        }
        length = length - 1;
      } while (length != 0);
    }
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliOptimizeHuffmanCountsForRle(size_t length, uint32_t* counts,
                                       uint8_t* good_for_rle) {
  size_t nonzero_count = 0;
  size_t stride;
  size_t limit;
  size_t sum;
  const size_t streak_limit = 1240;
  /* Let's make the Huffman code more compatible with RLE encoding. */
  size_t i;
  for (i = 0; i < length; i++) {
    if (counts[i]) {
      ++nonzero_count;
    }
  }
  if (nonzero_count < 16) {
    return;
  }
  while (length != 0 && counts[length - 1] == 0) {
    --length;
  }
  if (length == 0) {
    return;  /* All zeros. */
  }
  /* Now counts[0..length - 1] does not have trailing zeros. */
  {
    size_t nonzeros = 0;
    uint32_t smallest_nonzero = 1 << 30;
    for (i = 0; i < length; ++i) {
      if (counts[i] != 0) {
        ++nonzeros;
        if (smallest_nonzero > counts[i]) {
          smallest_nonzero = counts[i];
        }
      }
    }
    if (nonzeros < 5) {
      /* Small histogram will model it well. */
      return;
    }
    if (smallest_nonzero < 4) {
      size_t zeros = length - nonzeros;
      if (zeros < 6) {
        for (i = 1; i < length - 1; ++i) {
          if (counts[i - 1] != 0 && counts[i] == 0 && counts[i + 1] != 0) {
            counts[i] = 1;
          }
        }
      }
    }
    if (nonzeros < 28) {
      return;
    }
  }
  /* 2) Let's mark all population counts that already can be encoded
     with an RLE code. */
  memset(good_for_rle, 0, length);
  {
    /* Let's not spoil any of the existing good RLE codes.
       Mark any seq of 0's that is longer as 5 as a good_for_rle.
       Mark any seq of non-0's that is longer as 7 as a good_for_rle. */
    uint32_t symbol = counts[0];
    size_t step = 0;
    for (i = 0; i <= length; ++i) {
      if (i == length || counts[i] != symbol) {
        if ((symbol == 0 && step >= 5) ||
            (symbol != 0 && step >= 7)) {
          size_t k;
          for (k = 0; k < step; ++k) {
            good_for_rle[i - k - 1] = 1;
          }
        }
        step = 1;
        if (i != length) {
          symbol = counts[i];
        }
      } else {
        ++step;
      }
    }
  }
  /* 3) Let's replace those population counts that lead to more RLE codes.
     Math here is in 24.8 fixed point representation. */
  stride = 0;
  limit = 256 * (counts[0] + counts[1] + counts[2]) / 3 + 420;
  sum = 0;
  for (i = 0; i <= length; ++i) {
    if (i == length || good_for_rle[i] ||
        (i != 0 && good_for_rle[i - 1]) ||
        (256 * counts[i] - limit + streak_limit) >= 2 * streak_limit) {
      if (stride >= 4 || (stride >= 3 && sum == 0)) {
        size_t k;
        /* The stride must end, collapse what we have, if we have enough (4). */
        size_t count = (sum + stride / 2) / stride;
        if (count == 0) {
          count = 1;
        }
        if (sum == 0) {
          /* Don't make an all zeros stride to be upgraded to ones. */
          count = 0;
        }
        for (k = 0; k < stride; ++k) {
          /* We don't want to change value at counts[i],
             that is already belonging to the next stride. Thus - 1. */
          counts[i - k - 1] = (uint32_t)count;
        }
      }
      stride = 0;
      sum = 0;
      if (i < length - 2) {
        /* All interesting strides have a count of at least 4, */
        /* at least when non-zeros. */
        limit = 256 * (counts[i] + counts[i + 1] + counts[i + 2]) / 3 + 420;
      } else if (i < length) {
        limit = 256 * counts[i];
      } else {
        limit = 0;
      }
    }
    ++stride;
    if (i != length) {
      sum += counts[i];
      if (stride >= 4) {
        limit = (256 * sum + stride / 2) / stride;
      }
      if (stride == 4) {
        limit += 120;
      }
    }
  }
}